

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall gl4cts::GPUShaderFP64Test2::prepareUniformTypes(GPUShaderFP64Test2 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  *this_00;
  uniformTypeDetails uStack_48;
  
  this_00 = &this->m_uniform_types;
  uniformTypeDetails::uniformTypeDetails(&uStack_48,1,1);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  paVar1 = &uStack_48.m_type_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,1,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,1,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,1,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,2,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,2,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,2,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,3,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,3,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,3,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,4,2);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,4,3);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  uniformTypeDetails::uniformTypeDetails(&uStack_48,4,4);
  std::
  vector<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
  ::emplace_back<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>(this_00,&uStack_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uStack_48.m_type_name._M_dataplus._M_p != paVar1) {
    operator_delete(uStack_48.m_type_name._M_dataplus._M_p,
                    uStack_48.m_type_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformTypes()
{
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 1 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(1 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(2 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(3 /* n_columns */, 4 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 2 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 3 /* n_rows */));
	m_uniform_types.push_back(uniformTypeDetails(4 /* n_columns */, 4 /* n_rows */));
}